

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintExpressionContents::visitTupleExtract(PrintExpressionContents *this,TupleExtract *curr)

{
  TupleExtract *curr_local;
  PrintExpressionContents *this_local;
  
  printMedium(this->o,"tuple.extract ");
  std::ostream::operator<<(this->o,curr->index);
  return;
}

Assistant:

void visitTupleExtract(TupleExtract* curr) {
    printMedium(o, "tuple.extract ");
    o << curr->index;
  }